

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O3

int __thiscall CVmResFileSource::seek(CVmResFileSource *this,long ofs,int mode)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (mode == 2) {
    ofs = (ofs + this->end) - this->start;
  }
  else if (mode == 1) {
    iVar1 = (*(this->super_CVmDataSource)._vptr_CVmDataSource[7])(this);
    ofs = ofs + CONCAT44(extraout_var,iVar1);
  }
  else if (mode != 0) {
    return 1;
  }
  if ((-1 < ofs) && ((ulong)ofs <= this->end - this->start)) {
    iVar1 = fseek((FILE *)this->fp,this->start + ofs,0);
    return iVar1;
  }
  return 1;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        switch (mode)
        {
        case OSFSK_SET:
        do_set:
            /* check that 'ofs' is in range */
            if (ofs < 0 || (unsigned long)ofs > end - start)
                return 1;

            /* seek to the offset */
            return osfseek(fp, start + ofs, OSFSK_SET);

        case OSFSK_CUR:
            /* set the offset relative to the current position */
            ofs += get_pos();
            goto do_set;

        case OSFSK_END:
            /* set the offset relative to the end of the file */
            ofs += (end - start);
            goto do_set;

        default:
            /* invalid mode */
            return 1;
        }
    }